

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O3

boolean does_block(level *lev,int x,int y,monst *excludemon)

{
  byte bVar1;
  monst *pmVar2;
  obj *poVar3;
  
  bVar1 = lev->locations[x][y].typ;
  if ('\x10' < (char)bVar1) {
    if (bVar1 < 0x17) {
      if (bVar1 == 0x12) {
        if ((u._1052_1_ & 2) != 0) {
          return '\x01';
        }
      }
      else if (bVar1 == 0x13) {
        return '\x01';
      }
    }
    else {
      if (bVar1 == 0x26) {
        return '\x01';
      }
      if ((bVar1 == 0x17) && ((*(ushort *)&lev->locations[x][y].field_0x6 & 0x1c0) != 0)) {
        return '\x01';
      }
    }
    for (poVar3 = lev->objects[x][y]; poVar3 != (obj *)0x0; poVar3 = (poVar3->v).v_nexthere) {
      if (poVar3->otyp == 0x214) {
        return '\x01';
      }
    }
    pmVar2 = lev->monsters[x][y];
    if (pmVar2 == (monst *)0x0) {
      return '\0';
    }
    if ((*(uint *)&pmVar2->field_0x60 >> 9 & 1) != 0) {
      return '\0';
    }
    if ((((*(uint *)&pmVar2->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) {
      if (pmVar2 == excludemon) {
        return '\0';
      }
    }
    else {
      if (pmVar2 == excludemon) {
        return '\0';
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return '\0';
      }
    }
    if (pmVar2->data != mons + 0x153) {
      if (pmVar2->m_ap_type == '\x02') {
        if (pmVar2->mappearance != 0x214) {
          return '\0';
        }
      }
      else if ((pmVar2->m_ap_type != '\x01') || (1 < pmVar2->mappearance - 0x1b)) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

boolean does_block(struct level *lev, int x, int y, const struct monst *excludemon)
{
    struct obj   *obj;
    struct monst *mon;
    struct rm *loc = &lev->locations[x][y];

    /* Features that block . . */
    if (IS_ROCK(loc->typ) || loc->typ == TREE || (IS_DOOR(loc->typ) &&
			    (loc->doormask & (D_CLOSED|D_LOCKED|D_TRAPPED) )))
	return 1;

    if (loc->typ == CLOUD || loc->typ == WATER ||
			(loc->typ == MOAT && Underwater))
	return 1;

    /* Boulders block light. */
    for (obj = lev->objects[x][y]; obj; obj = obj->nexthere)
	if (obj->otyp == BOULDER) return 1;

    /* Mimics mimicing a door or boulder block light. */
    if ((mon = m_at(lev, x,y)) && (!mon->minvis || See_invisible) &&
	(excludemon == NULL || mon != excludemon) &&
	(mon->data == &mons[PM_GIANT_TURTLE] ||
	 ((mon->m_ap_type == M_AP_FURNITURE &&
	   (mon->mappearance == S_hcdoor || mon->mappearance == S_vcdoor)) ||
	  (mon->m_ap_type == M_AP_OBJECT && mon->mappearance == BOULDER))))
	return 1;

    return 0;
}